

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall REPL::REPL(REPL *this)

{
  allocator<int> local_3d;
  value_type local_3c;
  vector<int,_std::allocator<int>_> local_38;
  int local_20;
  int i;
  REPL *local_10;
  REPL *this_local;
  
  local_10 = this;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->board);
  AI::AI(&this->ai,&this->board);
  for (local_20 = 0; local_20 < 0xf; local_20 = local_20 + 1) {
    local_3c = 0;
    std::allocator<int>::allocator(&local_3d);
    std::vector<int,_std::allocator<int>_>::vector(&local_38,0xf,&local_3c,&local_3d);
    std::
    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
    ::emplace_back<std::vector<int,std::allocator<int>>>
              ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)this,&local_38);
    std::vector<int,_std::allocator<int>_>::~vector(&local_38);
    std::allocator<int>::~allocator(&local_3d);
  }
  return;
}

Assistant:

REPL::REPL() : ai(board) {
    for (int i = 0; i < BOARD_SIZE; i++) {
        board.emplace_back(move(vector<int>(BOARD_SIZE, 0)));
    }
}